

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_array<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  comment_type *this;
  pointer peVar1;
  pointer peVar2;
  element_type *peVar3;
  size_t sVar4;
  pointer peVar5;
  long lVar6;
  undefined4 uVar7;
  char_type_conflict cVar8;
  value_type *v;
  reference __args;
  error_type *peVar9;
  error_type *peVar10;
  value_type *pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  error_info *v_00;
  ulong __n;
  basic_value<toml::type_config> *__args_00;
  string *this_00;
  bool bVar12;
  bool bVar13;
  array_format_info fmt;
  ulong local_8c0;
  optional<toml::detail::multiline_spacer<toml::type_config>_> spacer;
  array_type val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_848;
  array_type local_828;
  _Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> local_808;
  string local_7e0;
  string local_7c0;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  type elem;
  source_location src;
  location first;
  region local_4d8;
  source_location local_470;
  source_location local_3f8;
  source_location local_380;
  error_info local_308;
  error_info local_2b0;
  error_info local_258;
  basic_value<toml::type_config> local_200;
  error_info local_138;
  error_info local_e0;
  error_info local_88;
  basic_value<toml::type_config> *v_01;
  
  peVar1 = (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  peVar2 = (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
           _M_impl.super__Vector_impl_data._M_start;
  location::location(&first,loc);
  peVar3 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((loc->location_ <
       (ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start)) &&
     (cVar8 = location::current(loc), cVar8 == '[')) {
    location::advance(loc,1);
    val.
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    val.
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    val.
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    skip_multiline_spacer<toml::type_config>(&spacer,loc,ctx,false);
    local_8c0 = 0x400000201;
    if ((spacer.
         super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
         _M_payload.
         super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
         .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
         _M_engaged &
        spacer.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
        ._M_payload.
        super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
        .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload
        ._M_value.newline_found) != 0) {
      local_8c0 = 0x400000202;
    }
    bVar13 = true;
    this = &elem.comments_;
    uVar7 = 0;
    while (peVar3 = (loc->source_).
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
          loc->location_ <
          (ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start)) {
      cVar8 = location::current(loc);
      if (cVar8 == ']') {
        if (((spacer.
              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
              _M_payload.
              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
              .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
              _M_engaged == true) &&
            (spacer.
             super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
             _M_payload.
             super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
             .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
             _M_payload._M_value.newline_found == true)) &&
           (spacer.
            super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
            _M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_payload._M_value.indent_type != none)) {
          local_8c0 = local_8c0 & 0xffffffffffff00ff |
                      (ulong)spacer.
                             super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                             .
                             super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                             ._M_payload._M_value.indent_type << 8;
          uVar7 = spacer.
                  super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                  .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                  _M_payload._M_value.indent;
        }
        break;
      }
      if (!bVar13) {
        region::region((region *)&elem,loc);
        source_location::source_location(&src,(region *)&elem);
        region::~region((region *)&elem);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_718,
                   "toml::parse_array: expected value-separator `,` or closing `]`",
                   (allocator<char> *)&com_res);
        source_location::source_location(&local_3f8,&src);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_738,"here",(allocator<char> *)&local_808);
        make_error_info<>((error_info *)&elem,&local_718,&local_3f8,&local_738);
        err<toml::error_info>((failure<toml::error_info> *)&local_e0,(error_info *)&elem);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_e0);
        error_info::~error_info(&local_e0);
        error_info::~error_info((error_info *)&elem);
        std::__cxx11::string::~string((string *)&local_738);
        source_location::~source_location(&local_3f8);
        this_00 = &local_718;
        goto LAB_002eebe4;
      }
      if (((spacer.
            super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
            _M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_engaged == true) &&
          (spacer.
           super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
           _M_payload.
           super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
           .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
           _M_payload._M_value.newline_found == true)) &&
         (spacer.
          super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
          _M_payload.
          super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
          .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
          _M_payload._M_value.indent_type != none)) {
        local_8c0 = (ulong)((uint)local_8c0 & 0xffff00ff) |
                    (ulong)spacer.
                           super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                           .
                           super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                           ._M_payload._M_value.indent_type << 8 |
                    (ulong)(uint)spacer.
                                 super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                                 ._M_payload._M_value.indent << 0x20;
      }
      parse_value<toml::type_config>
                ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)&src,loc,ctx);
      if (src.is_ok_ == true) {
        v = result<toml::basic_value<toml::type_config>,_toml::error_info>::unwrap
                      ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)&src,
                       (source_location)0x45b4a8);
        basic_value<toml::type_config>::basic_value(&elem,v);
        if (spacer.
            super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
            _M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_engaged == true) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this,(undefined1 *)
                                   ((long)&spacer.
                                           super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                                           ._M_payload + 8));
        }
        skip_multiline_spacer<toml::type_config>
                  ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)&com_res,loc,ctx,
                   false);
        std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
        _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *
                       )&spacer,(_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                                 *)&com_res);
        std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
                  ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)
                   &com_res);
        if (spacer.
            super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
            _M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_engaged == true) {
          __n = 0;
          while( true ) {
            if ((spacer.
                 super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                 .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                 _M_engaged & 1U) == 0) {
              std::__throw_bad_optional_access();
            }
            if ((ulong)((long)spacer.
                              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                              .
                              super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                              ._M_payload._M_value.comments.comments.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        spacer.
                        super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                        .
                        super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                        ._M_payload._8_8_ >> 5) <= __n) break;
            __args = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&spacer.
                           super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                           .
                           super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                           ._M_payload._M_value.comments.comments,__n);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                       __args);
            __n = __n + 1;
          }
          if (spacer.
              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
              _M_payload.
              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
              .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
              _M_payload._M_value.newline_found == true) {
            local_8c0 = local_8c0 & 0xffffffffffffff00 | 2;
          }
        }
        local_808._M_payload._0_8_ = &PTR__scanner_base_0045a940;
        local_808._M_payload._8_1_ = ',';
        character::scan((region *)&com_res,(character *)&local_808,loc);
        lVar6 = CONCAT71(com_res._1_7_,com_res.is_ok_);
        bVar13 = lVar6 != 0;
        region::~region((region *)&com_res);
        parse_comment_line<toml::type_config>(&com_res,loc,ctx);
        if (com_res.is_ok_ == false) {
          peVar10 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    ::unwrap_err(&com_res,(source_location)0x45b4c0);
          error_info::error_info(&local_258,peVar10);
          std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
          emplace_back<toml::error_info>(&ctx->errors_,&local_258);
          error_info::~error_info(&local_258);
        }
        if (((com_res.is_ok_ & 1U) == 0) ||
           (pvVar11 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      ::unwrap(&com_res,(source_location)0x45b4d8),
           (pvVar11->
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           )._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged != true)) {
          bVar12 = false;
        }
        else {
          pvVar11 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    ::unwrap(&com_res,(source_location)0x45b4f0);
          __x = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value(pvVar11);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this,(value_type *)__x);
          local_8c0 = local_8c0 & 0xffffffffffffff00 | 2;
          bVar12 = true;
        }
        if (lVar6 != 0) {
          skip_multiline_spacer<toml::type_config>
                    ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)&local_808,loc,
                     ctx,bVar12);
          std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
          _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                          *)&spacer,&local_808);
          std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
                    (&local_808);
          if ((spacer.
               super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
               ._M_payload.
               super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
               .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
               _M_engaged == true) &&
             (spacer.
              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
              _M_payload.
              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
              .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
              _M_payload._M_value.newline_found == true)) {
            local_8c0 = local_8c0 & 0xffffffffffffff00 | 2;
          }
        }
        __args_00 = &elem;
        std::
        vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
        ::emplace_back<toml::basic_value<toml::type_config>>
                  ((vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
                    *)&val,__args_00);
        result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
        ::cleanup(&com_res,(EVP_PKEY_CTX *)__args_00);
        basic_value<toml::type_config>::~basic_value(&elem);
        bVar12 = true;
      }
      else {
        peVar9 = result<toml::basic_value<toml::type_config>,_toml::error_info>::unwrap_err
                           ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)&src,
                            (source_location)0x45b508);
        error_info::error_info(&local_2b0,peVar9);
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
        emplace_back<toml::error_info>(&ctx->errors_,&local_2b0);
        error_info::~error_info(&local_2b0);
        sVar4 = loc->location_;
        __args_00 = (basic_value<toml::type_config> *)ctx;
        skip_value<toml::type_config>(loc,ctx);
        bVar12 = sVar4 != loc->location_;
        bVar13 = true;
      }
      result<toml::basic_value<toml::type_config>,_toml::error_info>::cleanup
                ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)&src,
                 (EVP_PKEY_CTX *)__args_00);
      if (!bVar12) break;
    }
    cVar8 = location::current(loc);
    if (cVar8 == ']') {
      location::advance(loc,1);
      peVar5 = (ctx->errors_).
               super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)peVar1 - (long)peVar2 ==
          (long)peVar5 -
          (long)(ctx->errors_).
                super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
                super__Vector_impl_data._M_start) {
        local_828.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             val.
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_828.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             val.
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_828.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             val.
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        val.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        val.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        val.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_848.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_848.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_848.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        region::region(&local_4d8,&first,loc);
        fmt.closing_indent = uVar7;
        fmt.fmt = (undefined1)local_8c0;
        fmt.indent_type = local_8c0._1_1_;
        fmt._2_2_ = local_8c0._2_2_;
        fmt.body_indent = local_8c0._4_4_;
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)&src,&local_828,fmt,&local_848,&local_4d8);
        ok<toml::basic_value<toml::type_config>>
                  ((success<toml::basic_value<toml::type_config>_> *)&local_200,(toml *)&src,v_01);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (__return_storage_ptr__,(success_type *)&local_200);
        basic_value<toml::type_config>::~basic_value(&local_200);
        basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&src);
        region::~region(&local_4d8);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_848);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::~vector(&local_828);
      }
      else {
        err<toml::error_info_const&>
                  ((failure<toml::error_info> *)&local_308,(toml *)(peVar5 + -1),v_00);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_308);
        error_info::~error_info(&local_308);
      }
    }
    else {
      region::region((region *)&elem,loc);
      source_location::source_location(&src,(region *)&elem);
      region::~region((region *)&elem);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c0,"toml::parse_array: missing closing bracket `]`",
                 (allocator<char> *)&com_res);
      source_location::source_location(&local_470,&src);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e0,"expected `]`, reached EOF",(allocator<char> *)&local_808);
      make_error_info<>((error_info *)&elem,&local_7c0,&local_470,&local_7e0);
      err<toml::error_info>((failure<toml::error_info> *)&local_138,(error_info *)&elem);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_138);
      error_info::~error_info(&local_138);
      error_info::~error_info((error_info *)&elem);
      std::__cxx11::string::~string((string *)&local_7e0);
      source_location::~source_location(&local_470);
      this_00 = &local_7c0;
LAB_002eebe4:
      std::__cxx11::string::~string((string *)this_00);
      source_location::~source_location(&src);
    }
    std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
              ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)&spacer
              );
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::~vector(&val);
  }
  else {
    region::region((region *)&elem,loc);
    source_location::source_location(&src,(region *)&elem);
    region::~region((region *)&elem);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"toml::parse_array: The next token is not an array",
               (allocator<char> *)&com_res);
    source_location::source_location(&local_380,&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f8,"here",(allocator<char> *)&spacer);
    make_error_info<>((error_info *)&elem,&local_6d8,&local_380,&local_6f8);
    err<toml::error_info>((failure<toml::error_info> *)&local_88,(error_info *)&elem);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_88);
    error_info::~error_info(&local_88);
    error_info::~error_info((error_info *)&elem);
    std::__cxx11::string::~string((string *)&local_6f8);
    source_location::~source_location(&local_380);
    std::__cxx11::string::~string((string *)&local_6d8);
    source_location::~source_location(&src);
  }
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_array(location& loc, context<TC>& ctx)
{
    const auto num_errors = ctx.errors().size();

    const auto first = loc;

    if(loc.eof() || loc.current() != '[')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_array: "
                "The next token is not an array", std::move(src), "here"));
    }
    loc.advance();

    typename basic_value<TC>::array_type val;

    array_format_info fmt;
    fmt.fmt = array_format::oneline;
    fmt.indent_type = indent_char::none;

    auto spacer = skip_multiline_spacer(loc, ctx);
    if(spacer.has_value() && spacer.value().newline_found)
    {
        fmt.fmt = array_format::multiline;
    }

    bool comma_found = true;
    while( ! loc.eof())
    {
        if(loc.current() == location::char_type(']'))
        {
            if(spacer.has_value() && spacer.value().newline_found &&
                spacer.value().indent_type != indent_char::none)
            {
                fmt.indent_type    = spacer.value().indent_type;
                fmt.closing_indent = spacer.value().indent;
            }
            break;
        }

        if( ! comma_found)
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_array: "
                    "expected value-separator `,` or closing `]`",
                    std::move(src), "here"));
        }

        if(spacer.has_value() && spacer.value().newline_found &&
            spacer.value().indent_type != indent_char::none)
        {
            fmt.indent_type = spacer.value().indent_type;
            fmt.body_indent = spacer.value().indent;
        }

        if(auto elem_res = parse_value(loc, ctx))
        {
            auto elem = std::move(elem_res.unwrap());

            if(spacer.has_value()) // copy previous comments to value
            {
                elem.comments() = std::move(spacer.value().comments);
            }

            // parse spaces between a value and a comma
            // array = [
            //     42    , # the answer
            //       ^^^^
            //     3.14 # pi
            //   , 2.71 ^^^^
            // ^^
            spacer = skip_multiline_spacer(loc, ctx);
            if(spacer.has_value())
            {
                for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                {
                    elem.comments().push_back(std::move(spacer.value().comments.at(i)));
                }
                if(spacer.value().newline_found)
                {
                    fmt.fmt = array_format::multiline;
                }
            }

            comma_found = character(',').scan(loc).is_ok();

            // parse comment after a comma
            // array = [
            //     42    , # the answer
            //             ^^^^^^^^^^^^
            //     3.14 # pi
            //          ^^^^
            // ]
            auto com_res = parse_comment_line(loc, ctx);
            if(com_res.is_err())
            {
                ctx.report_error(com_res.unwrap_err());
            }

            const bool comment_found = com_res.is_ok() && com_res.unwrap().has_value();
            if(comment_found)
            {
                fmt.fmt = array_format::multiline;
                elem.comments().push_back(com_res.unwrap().value());
            }
            if(comma_found)
            {
                spacer = skip_multiline_spacer(loc, ctx, comment_found);
                if(spacer.has_value() && spacer.value().newline_found)
                {
                    fmt.fmt = array_format::multiline;
                }
            }
            val.push_back(std::move(elem));
        }
        else
        {
            // if err, push error to ctx and try recovery.
            ctx.report_error(std::move(elem_res.unwrap_err()));

            // if it looks like some value, then skip the value.
            // otherwise, it may be a new key-value pair or a new table and
            // the error is "missing closing ]". stop parsing.

            const auto before_skip = loc.get_location();
            skip_value(loc, ctx);
            if(before_skip == loc.get_location()) // cannot skip! break...
            {
                break;
            }
        }
    }

    if(loc.current() != ']')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_array: missing closing bracket `]`",
            std::move(src), "expected `]`, reached EOF"));
    }
    else
    {
        loc.advance();
    }
    // any error reported from this function
    if(num_errors != ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.errors().back());
    }

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, region(first, loc)
        ));
}